

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_groestl.c
# Opt level: O0

void Transform(groestlHashState *ctx,uint8_t *input,int msglen)

{
  int in_EDX;
  long in_RDI;
  uint32_t *in_stack_000000e8;
  uint32_t *in_stack_000000f0;
  undefined4 local_14;
  
  for (local_14 = in_EDX; 0x3f < local_14; local_14 = local_14 + -0x40) {
    F512(in_stack_000000f0,in_stack_000000e8);
    *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + 1;
    if (*(int *)(in_RDI + 0x40) == 0) {
      *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) + 1;
    }
  }
  return;
}

Assistant:

static void Transform(groestlHashState *ctx,
	       const uint8_t *input, 
	       int msglen) {

  /* digest message, one block at a time */
  for (; msglen >= SIZE512; 
       msglen -= SIZE512, input += SIZE512) {
    F512(ctx->chaining,(uint32_t*)input);

    /* increment block counter */
    ctx->block_counter1++;
    if (ctx->block_counter1 == 0) ctx->block_counter2++;
  }
}